

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O2

void duckdb::BitwiseOperation::Combine<duckdb::BitState<unsigned_int>,duckdb::BitXorOperation>
               (BitState<unsigned_int> *source,BitState<unsigned_int> *target,
               AggregateInputData *param_3)

{
  if (source->is_set == true) {
    if (target->is_set == false) {
      target->value = source->value;
      target->is_set = true;
      return;
    }
    target->value = target->value ^ source->value;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}